

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

i8 wherePathSatisfiesOrderBy
             (WhereInfo *pWInfo,ExprList *pOrderBy,WherePath *pPath,u16 wctrlFlags,u16 nLoop,
             WhereLoop *pLast,Bitmask *pRevMask)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  Expr *pEVar8;
  CollSeq *pCVar9;
  ushort in_CX;
  long in_RDX;
  uint *in_RSI;
  undefined8 *in_RDI;
  ushort in_R8W;
  long in_R9;
  bool bVar10;
  bool bVar11;
  ulong *in_stack_00000008;
  Bitmask m;
  Bitmask mTerm;
  Expr *p;
  Expr *pIdxExpr;
  Expr *pX;
  u16 eOp;
  u8 bOnce;
  Bitmask ready;
  Bitmask orderDistinctMask;
  Bitmask obDone;
  Bitmask obSat;
  sqlite3 *db;
  Index *pIndex;
  CollSeq *pColl;
  Expr *pOBExpr;
  WhereTerm *pTerm;
  WhereLoop *pLoop;
  int iColumn;
  int iCur;
  int j;
  int i;
  int iLoop;
  u16 nOrderBy;
  u16 nColumn;
  u16 nKeyCol;
  u16 eqOpMask;
  u8 isMatch;
  u8 distinctColumns;
  u8 isOrderDistinct;
  u8 revIdx;
  u8 rev;
  u8 revSet;
  Expr *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff25;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 uVar12;
  Expr *in_stack_ffffffffffffff28;
  Parse *in_stack_ffffffffffffff30;
  ulong local_a0;
  ulong local_90;
  long local_80;
  Index *in_stack_ffffffffffffff98;
  long lVar13;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb4;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ushort local_3c;
  ushort local_3a;
  ushort local_38;
  byte local_33;
  byte local_32;
  
  local_90 = 0;
  if (((in_R8W != 0) && ((*(ushort *)(*(long *)*in_RDI + 0x5c) & 0x40) != 0)) ||
     (uVar16 = *in_RSI, 0x3f < (ushort)uVar16)) {
    return '\0';
  }
  bVar11 = true;
  uVar7 = (1L << ((byte)uVar16 & 0x3f)) - 1;
  local_a0 = 0;
  local_38 = 0x182;
  if ((in_CX & 0x800) != 0) {
    local_38 = 0x183;
  }
  iVar17 = 0;
  do {
    uVar12 = false;
    if ((bVar11) && (uVar12 = false, local_90 < uVar7)) {
      uVar12 = iVar17 <= (int)(uint)in_R8W;
    }
    if ((bool)uVar12 == false) goto LAB_001c9692;
    lVar13 = in_R9;
    if (((int)(uint)in_R8W <= iVar17) ||
       (lVar13 = *(long *)(*(long *)(in_RDX + 0x18) + (long)iVar17 * 8), (in_CX & 0x800) == 0)) {
      if ((*(uint *)(lVar13 + 0x28) & 0x400) != 0) {
        if (*(char *)(lVar13 + 0x1d) != '\0') {
          local_90 = uVar7;
        }
LAB_001c9692:
        if (local_90 == uVar7) {
          return (byte)uVar16;
        }
        if (bVar11) {
          return -1;
        }
        uVar16 = uVar16 & 0xffff;
        do {
          uVar16 = uVar16 - 1;
          if ((int)uVar16 < 1) {
            return '\0';
          }
          uVar7 = (1L << ((byte)uVar16 & 0x3f)) - 1;
        } while ((local_90 & uVar7) != uVar7);
        return (byte)uVar16;
      }
      *(undefined2 *)(lVar13 + 0x1e) = 0;
      iVar15 = *(int *)(in_RDI[1] + (ulong)*(byte *)(lVar13 + 0x10) * 0x70 + 0x48);
      for (iVar14 = 0; iVar14 < (int)(uVar16 & 0xffff); iVar14 = iVar14 + 1) {
        if (((((1L << ((byte)iVar14 & 0x3f) & local_90) == 0) &&
             (pEVar8 = sqlite3ExprSkipCollate(*(Expr **)(in_RSI + (long)iVar14 * 8 + 2)),
             pEVar8->op == 0x9e)) && (pEVar8->iTable == iVar15)) &&
           (in_stack_ffffffffffffff98 =
                 (Index *)sqlite3WhereFindTerm
                                    ((WhereClause *)CONCAT44(iVar17,iVar14),
                                     in_stack_ffffffffffffffb4,iVar15,
                                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                     (u32)((ulong)lVar13 >> 0x20),in_stack_ffffffffffffff98),
           in_stack_ffffffffffffff98 != (Index *)0x0)) {
          if (*(u16 *)((long)&in_stack_ffffffffffffff98->aiRowLogEst + 4) == 1) {
            in_stack_ffffffffffffffb4 = 0;
            while( true ) {
              bVar10 = false;
              if (in_stack_ffffffffffffffb4 < (int)(uint)*(ushort *)(lVar13 + 0x2c)) {
                bVar10 = in_stack_ffffffffffffff98 !=
                         *(Index **)(*(long *)(lVar13 + 0x38) + (long)in_stack_ffffffffffffffb4 * 8)
                ;
              }
              if (!bVar10) break;
              in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1;
            }
            in_stack_ffffffffffffff26 = 0;
            if ((int)(uint)*(ushort *)(lVar13 + 0x2c) <= in_stack_ffffffffffffffb4)
            goto LAB_001c8f1d;
          }
          if (((((ulong)in_stack_ffffffffffffff98->aiRowLogEst & 0x8200000000) == 0) ||
              (pEVar8->iColumn < 0)) ||
             (iVar6 = sqlite3ExprCollSeqMatch
                                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                                 (Expr *)CONCAT17(uVar12,CONCAT16(in_stack_ffffffffffffff26,
                                                                  CONCAT15(in_stack_ffffffffffffff25
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20))))), iVar6 != 0)) {
            local_90 = 1L << ((byte)iVar14 & 0x3f) | local_90;
          }
        }
LAB_001c8f1d:
      }
      if ((*(uint *)(lVar13 + 0x28) & 0x1000) == 0) {
        if ((*(uint *)(lVar13 + 0x28) & 0x100) == 0) {
          local_80 = *(long *)(lVar13 + 0x20);
          if ((local_80 == 0) || ((*(ushort *)(local_80 + 99) >> 2 & 1) != 0)) {
            return '\0';
          }
          local_3a = *(ushort *)(local_80 + 0x5e);
          local_3c = *(ushort *)(local_80 + 0x60);
          bVar11 = *(char *)(local_80 + 0x62) != '\0';
        }
        else {
          local_80 = 0;
          local_3a = 0;
          local_3c = 1;
        }
        bVar10 = false;
        local_32 = 0;
        bVar5 = false;
        for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < (int)(uint)local_3c;
            in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
          bVar3 = true;
          if ((in_stack_ffffffffffffffb4 < (int)(uint)*(ushort *)(lVar13 + 0x18)) &&
             ((int)(uint)*(ushort *)(lVar13 + 0x2e) <= in_stack_ffffffffffffffb4)) {
            uVar1 = *(ushort *)
                     (*(long *)(*(long *)(lVar13 + 0x38) + (long)in_stack_ffffffffffffffb4 * 8) +
                     0x14);
            if ((uVar1 & local_38) == 0) {
              if ((uVar1 & 1) != 0) {
                iVar14 = in_stack_ffffffffffffffb4;
                do {
                  iVar14 = iVar14 + 1;
                  if ((int)(uint)*(ushort *)(lVar13 + 0x18) <= iVar14) goto LAB_001c915f;
                } while (**(long **)(*(long *)(lVar13 + 0x38) + (long)iVar14 * 8) !=
                         **(long **)(*(long *)(lVar13 + 0x38) + (long)in_stack_ffffffffffffffb4 * 8)
                        );
                bVar3 = false;
              }
              goto LAB_001c915f;
            }
            if ((uVar1 & 0x100) != 0) {
              bVar11 = false;
            }
          }
          else {
LAB_001c915f:
            if (local_80 == 0) {
              in_stack_ffffffffffffffac = -1;
              local_33 = 0;
            }
            else {
              in_stack_ffffffffffffffac =
                   (int)*(short *)(*(long *)(local_80 + 8) + (long)in_stack_ffffffffffffffb4 * 2);
              local_33 = *(byte *)(*(long *)(local_80 + 0x38) + (long)in_stack_ffffffffffffffb4);
              if (in_stack_ffffffffffffffac == *(short *)(*(long *)(local_80 + 0x18) + 0x44)) {
                in_stack_ffffffffffffffac = -1;
              }
            }
            if ((((bVar11) && (-1 < in_stack_ffffffffffffffac)) &&
                ((int)(uint)*(ushort *)(lVar13 + 0x18) <= in_stack_ffffffffffffffb4)) &&
               (*(char *)(*(long *)(*(long *)(local_80 + 0x18) + 8) +
                          (long)in_stack_ffffffffffffffac * 0x20 + 0x18) == '\0')) {
              bVar11 = false;
            }
            bVar4 = false;
            for (iVar14 = 0; bVar2 = iVar14 < (int)(uVar16 & 0xffff),
                in_stack_ffffffffffffff25 = bVar3 && bVar2, bVar3 && bVar2; iVar14 = iVar14 + 1) {
              if ((1L << ((byte)iVar14 & 0x3f) & local_90) == 0) {
                pEVar8 = sqlite3ExprSkipCollate(*(Expr **)(in_RSI + (long)iVar14 * 8 + 2));
                if ((in_CX & 0xc0) == 0) {
                  bVar3 = false;
                }
                if (in_stack_ffffffffffffffac < -1) {
                  iVar6 = sqlite3ExprCompareSkip
                                    ((Expr *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                                     CONCAT13(uVar12,CONCAT12(in_stack_ffffffffffffff26,
                                                              CONCAT11(in_stack_ffffffffffffff25,
                                                                       in_stack_ffffffffffffff24))))
                  ;
                  if (iVar6 == 0) goto LAB_001c936c;
                }
                else if (((pEVar8->op == 0x9e) && (pEVar8->iTable == iVar15)) &&
                        (pEVar8->iColumn == in_stack_ffffffffffffffac)) {
LAB_001c936c:
                  if (in_stack_ffffffffffffffac != -1) {
                    pCVar9 = sqlite3ExprNNCollSeq
                                       ((Parse *)CONCAT17(uVar12,CONCAT16(in_stack_ffffffffffffff26,
                                                                          CONCAT15(
                                                  in_stack_ffffffffffffff25,
                                                  CONCAT14(in_stack_ffffffffffffff24,
                                                           in_stack_ffffffffffffff20)))),
                                        in_stack_ffffffffffffff18);
                    iVar6 = sqlite3StrICmp(pCVar9->zName,
                                           *(char **)(*(long *)(local_80 + 0x40) +
                                                     (long)in_stack_ffffffffffffffb4 * 8));
                    if (iVar6 != 0) goto LAB_001c93f7;
                  }
                  *(short *)(lVar13 + 0x1e) = (short)in_stack_ffffffffffffffb4 + 1;
                  bVar4 = true;
                  break;
                }
              }
LAB_001c93f7:
            }
            if ((bVar4) && ((in_CX & 0x40) == 0)) {
              if (bVar10) {
                if ((local_32 ^ local_33) != (byte)in_RSI[(long)iVar14 * 8 + 8]) {
                  bVar4 = false;
                }
              }
              else {
                local_32 = local_33 ^ (byte)in_RSI[(long)iVar14 * 8 + 8];
                if (local_32 != 0) {
                  *in_stack_00000008 = 1L << ((byte)iVar17 & 0x3f) | *in_stack_00000008;
                }
                bVar10 = true;
              }
            }
            if (!bVar4) {
              if ((in_stack_ffffffffffffffb4 == 0) ||
                 (in_stack_ffffffffffffffb4 < (int)(uint)local_3a)) {
                bVar11 = false;
              }
              break;
            }
            if (in_stack_ffffffffffffffac == -1) {
              bVar5 = true;
            }
            local_90 = 1L << ((byte)iVar14 & 0x3f) | local_90;
          }
        }
        if (bVar5) {
          bVar11 = true;
        }
      }
      if (bVar11) {
        local_a0 = *(ulong *)(lVar13 + 8) | local_a0;
        for (iVar15 = 0; iVar15 < (int)(uVar16 & 0xffff); iVar15 = iVar15 + 1) {
          if (((1L << ((byte)iVar15 & 0x3f) & local_90) == 0) &&
             (((in_stack_ffffffffffffff30 =
                     (Parse *)sqlite3WhereExprUsage
                                        ((WhereMaskSet *)
                                         CONCAT17(uVar12,CONCAT16(in_stack_ffffffffffffff26,
                                                                  CONCAT15(in_stack_ffffffffffffff25
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20)))),
                                         in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff30 != (Parse *)0x0 ||
               (iVar14 = sqlite3ExprIsConstant((Expr *)0x1c9627), iVar14 != 0)) &&
              (((ulong)in_stack_ffffffffffffff30 & (local_a0 ^ 0xffffffffffffffff)) == 0)))) {
            local_90 = 1L << ((byte)iVar15 & 0x3f) | local_90;
          }
        }
      }
    }
    iVar17 = iVar17 + 1;
  } while( true );
}

Assistant:

static i8 wherePathSatisfiesOrderBy(
  WhereInfo *pWInfo,    /* The WHERE clause */
  ExprList *pOrderBy,   /* ORDER BY or GROUP BY or DISTINCT clause to check */
  WherePath *pPath,     /* The WherePath to check */
  u16 wctrlFlags,       /* WHERE_GROUPBY or _DISTINCTBY or _ORDERBY_LIMIT */
  u16 nLoop,            /* Number of entries in pPath->aLoop[] */
  WhereLoop *pLast,     /* Add this WhereLoop to the end of pPath->aLoop[] */
  Bitmask *pRevMask     /* OUT: Mask of WhereLoops to run in reverse order */
){
  u8 revSet;            /* True if rev is known */
  u8 rev;               /* Composite sort order */
  u8 revIdx;            /* Index sort order */
  u8 isOrderDistinct;   /* All prior WhereLoops are order-distinct */
  u8 distinctColumns;   /* True if the loop has UNIQUE NOT NULL columns */
  u8 isMatch;           /* iColumn matches a term of the ORDER BY clause */
  u16 eqOpMask;         /* Allowed equality operators */
  u16 nKeyCol;          /* Number of key columns in pIndex */
  u16 nColumn;          /* Total number of ordered columns in the index */
  u16 nOrderBy;         /* Number terms in the ORDER BY clause */
  int iLoop;            /* Index of WhereLoop in pPath being processed */
  int i, j;             /* Loop counters */
  int iCur;             /* Cursor number for current WhereLoop */
  int iColumn;          /* A column number within table iCur */
  WhereLoop *pLoop = 0; /* Current WhereLoop being processed. */
  WhereTerm *pTerm;     /* A single term of the WHERE clause */
  Expr *pOBExpr;        /* An expression from the ORDER BY clause */
  CollSeq *pColl;       /* COLLATE function from an ORDER BY clause term */
  Index *pIndex;        /* The index associated with pLoop */
  sqlite3 *db = pWInfo->pParse->db;  /* Database connection */
  Bitmask obSat = 0;    /* Mask of ORDER BY terms satisfied so far */
  Bitmask obDone;       /* Mask of all ORDER BY terms */
  Bitmask orderDistinctMask;  /* Mask of all well-ordered loops */
  Bitmask ready;              /* Mask of inner loops */

  /*
  ** We say the WhereLoop is "one-row" if it generates no more than one
  ** row of output.  A WhereLoop is one-row if all of the following are true:
  **  (a) All index columns match with WHERE_COLUMN_EQ.
  **  (b) The index is unique
  ** Any WhereLoop with an WHERE_COLUMN_EQ constraint on the rowid is one-row.
  ** Every one-row WhereLoop will have the WHERE_ONEROW bit set in wsFlags.
  **
  ** We say the WhereLoop is "order-distinct" if the set of columns from
  ** that WhereLoop that are in the ORDER BY clause are different for every
  ** row of the WhereLoop.  Every one-row WhereLoop is automatically
  ** order-distinct.   A WhereLoop that has no columns in the ORDER BY clause
  ** is not order-distinct. To be order-distinct is not quite the same as being
  ** UNIQUE since a UNIQUE column or index can have multiple rows that 
  ** are NULL and NULL values are equivalent for the purpose of order-distinct.
  ** To be order-distinct, the columns must be UNIQUE and NOT NULL.
  **
  ** The rowid for a table is always UNIQUE and NOT NULL so whenever the
  ** rowid appears in the ORDER BY clause, the corresponding WhereLoop is
  ** automatically order-distinct.
  */

  assert( pOrderBy!=0 );
  if( nLoop && OptimizationDisabled(db, SQLITE_OrderByIdxJoin) ) return 0;

  nOrderBy = pOrderBy->nExpr;
  testcase( nOrderBy==BMS-1 );
  if( nOrderBy>BMS-1 ) return 0;  /* Cannot optimize overly large ORDER BYs */
  isOrderDistinct = 1;
  obDone = MASKBIT(nOrderBy)-1;
  orderDistinctMask = 0;
  ready = 0;
  eqOpMask = WO_EQ | WO_IS | WO_ISNULL;
  if( wctrlFlags & WHERE_ORDERBY_LIMIT ) eqOpMask |= WO_IN;
  for(iLoop=0; isOrderDistinct && obSat<obDone && iLoop<=nLoop; iLoop++){
    if( iLoop>0 ) ready |= pLoop->maskSelf;
    if( iLoop<nLoop ){
      pLoop = pPath->aLoop[iLoop];
      if( wctrlFlags & WHERE_ORDERBY_LIMIT ) continue;
    }else{
      pLoop = pLast;
    }
    if( pLoop->wsFlags & WHERE_VIRTUALTABLE ){
      if( pLoop->u.vtab.isOrdered ) obSat = obDone;
      break;
    }else{
      pLoop->u.btree.nIdxCol = 0;
    }
    iCur = pWInfo->pTabList->a[pLoop->iTab].iCursor;

    /* Mark off any ORDER BY term X that is a column in the table of
    ** the current loop for which there is term in the WHERE
    ** clause of the form X IS NULL or X=? that reference only outer
    ** loops.
    */
    for(i=0; i<nOrderBy; i++){
      if( MASKBIT(i) & obSat ) continue;
      pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
      if( pOBExpr->op!=TK_COLUMN ) continue;
      if( pOBExpr->iTable!=iCur ) continue;
      pTerm = sqlite3WhereFindTerm(&pWInfo->sWC, iCur, pOBExpr->iColumn,
                       ~ready, eqOpMask, 0);
      if( pTerm==0 ) continue;
      if( pTerm->eOperator==WO_IN ){
        /* IN terms are only valid for sorting in the ORDER BY LIMIT 
        ** optimization, and then only if they are actually used
        ** by the query plan */
        assert( wctrlFlags & WHERE_ORDERBY_LIMIT );
        for(j=0; j<pLoop->nLTerm && pTerm!=pLoop->aLTerm[j]; j++){}
        if( j>=pLoop->nLTerm ) continue;
      }
      if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0 && pOBExpr->iColumn>=0 ){
        if( sqlite3ExprCollSeqMatch(pWInfo->pParse, 
                  pOrderBy->a[i].pExpr, pTerm->pExpr)==0 ){
          continue;
        }
        testcase( pTerm->pExpr->op==TK_IS );
      }
      obSat |= MASKBIT(i);
    }

    if( (pLoop->wsFlags & WHERE_ONEROW)==0 ){
      if( pLoop->wsFlags & WHERE_IPK ){
        pIndex = 0;
        nKeyCol = 0;
        nColumn = 1;
      }else if( (pIndex = pLoop->u.btree.pIndex)==0 || pIndex->bUnordered ){
        return 0;
      }else{
        nKeyCol = pIndex->nKeyCol;
        nColumn = pIndex->nColumn;
        assert( nColumn==nKeyCol+1 || !HasRowid(pIndex->pTable) );
        assert( pIndex->aiColumn[nColumn-1]==XN_ROWID
                          || !HasRowid(pIndex->pTable));
        isOrderDistinct = IsUniqueIndex(pIndex);
      }

      /* Loop through all columns of the index and deal with the ones
      ** that are not constrained by == or IN.
      */
      rev = revSet = 0;
      distinctColumns = 0;
      for(j=0; j<nColumn; j++){
        u8 bOnce = 1; /* True to run the ORDER BY search loop */

        assert( j>=pLoop->u.btree.nEq 
            || (pLoop->aLTerm[j]==0)==(j<pLoop->nSkip)
        );
        if( j<pLoop->u.btree.nEq && j>=pLoop->nSkip ){
          u16 eOp = pLoop->aLTerm[j]->eOperator;

          /* Skip over == and IS and ISNULL terms.  (Also skip IN terms when
          ** doing WHERE_ORDERBY_LIMIT processing). 
          **
          ** If the current term is a column of an ((?,?) IN (SELECT...)) 
          ** expression for which the SELECT returns more than one column,
          ** check that it is the only column used by this loop. Otherwise,
          ** if it is one of two or more, none of the columns can be
          ** considered to match an ORDER BY term.  */
          if( (eOp & eqOpMask)!=0 ){
            if( eOp & WO_ISNULL ){
              testcase( isOrderDistinct );
              isOrderDistinct = 0;
            }
            continue;  
          }else if( ALWAYS(eOp & WO_IN) ){
            /* ALWAYS() justification: eOp is an equality operator due to the
            ** j<pLoop->u.btree.nEq constraint above.  Any equality other
            ** than WO_IN is captured by the previous "if".  So this one
            ** always has to be WO_IN. */
            Expr *pX = pLoop->aLTerm[j]->pExpr;
            for(i=j+1; i<pLoop->u.btree.nEq; i++){
              if( pLoop->aLTerm[i]->pExpr==pX ){
                assert( (pLoop->aLTerm[i]->eOperator & WO_IN) );
                bOnce = 0;
                break;
              }
            }
          }
        }

        /* Get the column number in the table (iColumn) and sort order
        ** (revIdx) for the j-th column of the index.
        */
        if( pIndex ){
          iColumn = pIndex->aiColumn[j];
          revIdx = pIndex->aSortOrder[j];
          if( iColumn==pIndex->pTable->iPKey ) iColumn = XN_ROWID;
        }else{
          iColumn = XN_ROWID;
          revIdx = 0;
        }

        /* An unconstrained column that might be NULL means that this
        ** WhereLoop is not well-ordered
        */
        if( isOrderDistinct
         && iColumn>=0
         && j>=pLoop->u.btree.nEq
         && pIndex->pTable->aCol[iColumn].notNull==0
        ){
          isOrderDistinct = 0;
        }

        /* Find the ORDER BY term that corresponds to the j-th column
        ** of the index and mark that ORDER BY term off 
        */
        isMatch = 0;
        for(i=0; bOnce && i<nOrderBy; i++){
          if( MASKBIT(i) & obSat ) continue;
          pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
          testcase( wctrlFlags & WHERE_GROUPBY );
          testcase( wctrlFlags & WHERE_DISTINCTBY );
          if( (wctrlFlags & (WHERE_GROUPBY|WHERE_DISTINCTBY))==0 ) bOnce = 0;
          if( iColumn>=XN_ROWID ){
            if( pOBExpr->op!=TK_COLUMN ) continue;
            if( pOBExpr->iTable!=iCur ) continue;
            if( pOBExpr->iColumn!=iColumn ) continue;
          }else{
            Expr *pIdxExpr = pIndex->aColExpr->a[j].pExpr;
            if( sqlite3ExprCompareSkip(pOBExpr, pIdxExpr, iCur) ){
              continue;
            }
          }
          if( iColumn!=XN_ROWID ){
            pColl = sqlite3ExprNNCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
            if( sqlite3StrICmp(pColl->zName, pIndex->azColl[j])!=0 ) continue;
          }
          pLoop->u.btree.nIdxCol = j+1;
          isMatch = 1;
          break;
        }
        if( isMatch && (wctrlFlags & WHERE_GROUPBY)==0 ){
          /* Make sure the sort order is compatible in an ORDER BY clause.
          ** Sort order is irrelevant for a GROUP BY clause. */
          if( revSet ){
            if( (rev ^ revIdx)!=pOrderBy->a[i].sortOrder ) isMatch = 0;
          }else{
            rev = revIdx ^ pOrderBy->a[i].sortOrder;
            if( rev ) *pRevMask |= MASKBIT(iLoop);
            revSet = 1;
          }
        }
        if( isMatch ){
          if( iColumn==XN_ROWID ){
            testcase( distinctColumns==0 );
            distinctColumns = 1;
          }
          obSat |= MASKBIT(i);
        }else{
          /* No match found */
          if( j==0 || j<nKeyCol ){
            testcase( isOrderDistinct!=0 );
            isOrderDistinct = 0;
          }
          break;
        }
      } /* end Loop over all index columns */
      if( distinctColumns ){
        testcase( isOrderDistinct==0 );
        isOrderDistinct = 1;
      }
    } /* end-if not one-row */

    /* Mark off any other ORDER BY terms that reference pLoop */
    if( isOrderDistinct ){
      orderDistinctMask |= pLoop->maskSelf;
      for(i=0; i<nOrderBy; i++){
        Expr *p;
        Bitmask mTerm;
        if( MASKBIT(i) & obSat ) continue;
        p = pOrderBy->a[i].pExpr;
        mTerm = sqlite3WhereExprUsage(&pWInfo->sMaskSet,p);
        if( mTerm==0 && !sqlite3ExprIsConstant(p) ) continue;
        if( (mTerm&~orderDistinctMask)==0 ){
          obSat |= MASKBIT(i);
        }
      }
    }
  } /* End the loop over all WhereLoops from outer-most down to inner-most */
  if( obSat==obDone ) return (i8)nOrderBy;
  if( !isOrderDistinct ){
    for(i=nOrderBy-1; i>0; i--){
      Bitmask m = MASKBIT(i) - 1;
      if( (obSat&m)==m ) return i;
    }
    return 0;
  }
  return -1;
}